

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_16777232,_false,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::QuadMiMBIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  Scene *pSVar10;
  Ref<embree::Geometry> *pRVar11;
  Geometry *pGVar12;
  long lVar13;
  long lVar14;
  RTCFilterFunctionN p_Var15;
  float fVar16;
  float fVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 *puVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  undefined1 auVar37 [32];
  AABBNodeMB4D *node1;
  undefined1 *puVar38;
  ulong uVar39;
  undefined1 *puVar40;
  long lVar41;
  int iVar42;
  long lVar43;
  ulong uVar44;
  ulong uVar45;
  ulong *puVar46;
  ulong *puVar47;
  ulong uVar48;
  ulong uVar49;
  long lVar50;
  ulong uVar51;
  ulong uVar52;
  ulong uVar53;
  ulong uVar54;
  ulong uVar55;
  ulong uVar56;
  long lVar57;
  bool bVar58;
  bool bVar59;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [16];
  undefined1 auVar65 [32];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [16];
  undefined1 auVar71 [32];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [32];
  undefined1 auVar75 [64];
  undefined1 auVar76 [16];
  undefined1 auVar77 [32];
  undefined1 auVar78 [64];
  undefined1 auVar79 [16];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [64];
  float fVar85;
  undefined1 auVar86 [16];
  undefined1 auVar87 [32];
  float fVar89;
  float fVar90;
  float fVar91;
  undefined1 auVar88 [64];
  uint uVar92;
  undefined1 auVar93 [16];
  uint uVar95;
  uint uVar96;
  uint uVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  undefined1 auVar94 [64];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [64];
  undefined1 auVar104 [16];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [64];
  undefined1 auVar109 [16];
  undefined1 auVar110 [64];
  undefined1 auVar111 [16];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  undefined8 local_1760;
  undefined8 uStack_1758;
  undefined8 *local_1750;
  ulong local_1748;
  ulong local_1740;
  long local_1738;
  ulong local_1730;
  ulong local_1728;
  ulong local_1720;
  ulong local_1718;
  ulong local_1710;
  ulong local_1708;
  ulong local_1700;
  ulong local_16f8;
  RTCFilterFunctionNArguments local_16f0;
  undefined1 local_16c0 [32];
  undefined1 local_16a0 [32];
  undefined1 local_1680 [32];
  undefined1 local_1660 [32];
  undefined1 local_1640 [32];
  undefined1 local_1620 [32];
  undefined1 local_1600 [32];
  undefined1 local_15e0 [32];
  undefined1 local_15c0 [16];
  undefined1 local_15b0 [16];
  undefined1 local_15a0 [16];
  undefined1 local_1590 [16];
  undefined1 local_1580 [16];
  undefined1 local_1570 [16];
  undefined1 local_1560 [16];
  undefined1 local_1550 [16];
  undefined1 local_1540 [16];
  undefined1 local_1530 [16];
  undefined1 local_1520 [16];
  RTCHitN local_1510 [16];
  undefined4 local_1500;
  undefined4 uStack_14fc;
  undefined4 uStack_14f8;
  undefined4 uStack_14f4;
  undefined4 local_14f0;
  undefined4 uStack_14ec;
  undefined4 uStack_14e8;
  undefined4 uStack_14e4;
  undefined1 local_14e0 [16];
  undefined1 local_14d0 [16];
  undefined1 local_14c0 [16];
  undefined1 local_14b0 [16];
  uint local_14a0;
  uint uStack_149c;
  uint uStack_1498;
  uint uStack_1494;
  uint uStack_1490;
  uint uStack_148c;
  uint uStack_1488;
  uint uStack_1484;
  undefined1 local_1480 [32];
  undefined1 local_1460 [32];
  undefined4 local_1440;
  undefined4 uStack_143c;
  undefined4 uStack_1438;
  undefined4 uStack_1434;
  undefined4 uStack_1430;
  undefined4 uStack_142c;
  undefined4 uStack_1428;
  undefined4 uStack_1424;
  undefined8 local_1420;
  undefined8 uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined1 local_13e0 [32];
  undefined1 local_13c0 [32];
  undefined1 local_13a0 [32];
  undefined1 local_1380 [32];
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  undefined1 local_1320 [32];
  undefined1 local_1300 [32];
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  float local_12a0 [4];
  float fStack_1290;
  float fStack_128c;
  float fStack_1288;
  float fStack_1284;
  undefined1 local_1280 [32];
  undefined1 local_1260 [32];
  undefined1 local_1240 [32];
  undefined1 local_1220 [32];
  size_t local_1200;
  ulong local_11f8 [569];
  
  local_1200 = root.ptr;
  fVar1 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_15e0._4_4_ = fVar1;
  local_15e0._0_4_ = fVar1;
  local_15e0._8_4_ = fVar1;
  local_15e0._12_4_ = fVar1;
  local_15e0._16_4_ = fVar1;
  local_15e0._20_4_ = fVar1;
  local_15e0._24_4_ = fVar1;
  local_15e0._28_4_ = fVar1;
  auVar75 = ZEXT3264(local_15e0);
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_1600._4_4_ = fVar2;
  local_1600._0_4_ = fVar2;
  local_1600._8_4_ = fVar2;
  local_1600._12_4_ = fVar2;
  local_1600._16_4_ = fVar2;
  local_1600._20_4_ = fVar2;
  local_1600._24_4_ = fVar2;
  local_1600._28_4_ = fVar2;
  auVar78 = ZEXT3264(local_1600);
  fVar98 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_1620._4_4_ = fVar98;
  local_1620._0_4_ = fVar98;
  local_1620._8_4_ = fVar98;
  local_1620._12_4_ = fVar98;
  local_1620._16_4_ = fVar98;
  local_1620._20_4_ = fVar98;
  local_1620._24_4_ = fVar98;
  local_1620._28_4_ = fVar98;
  auVar84 = ZEXT3264(local_1620);
  fVar1 = fVar1 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar2 = fVar2 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar98 = fVar98 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  uVar45 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar49 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar52 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_1640._0_8_ = CONCAT44(fVar1,fVar1) ^ 0x8000000080000000;
  local_1640._8_4_ = -fVar1;
  local_1640._12_4_ = -fVar1;
  local_1640._16_4_ = -fVar1;
  local_1640._20_4_ = -fVar1;
  local_1640._24_4_ = -fVar1;
  local_1640._28_4_ = -fVar1;
  auVar88 = ZEXT3264(local_1640);
  local_1660._0_8_ = CONCAT44(fVar2,fVar2) ^ 0x8000000080000000;
  local_1660._8_4_ = -fVar2;
  local_1660._12_4_ = -fVar2;
  local_1660._16_4_ = -fVar2;
  local_1660._20_4_ = -fVar2;
  local_1660._24_4_ = -fVar2;
  local_1660._28_4_ = -fVar2;
  auVar94 = ZEXT3264(local_1660);
  local_1440 = 0x80000000;
  uStack_143c = 0x80000000;
  uStack_1438 = 0x80000000;
  uStack_1434 = 0x80000000;
  uStack_1430 = 0x80000000;
  uStack_142c = 0x80000000;
  uStack_1428 = 0x80000000;
  uStack_1424 = 0x80000000;
  local_1680._0_8_ = CONCAT44(fVar98,fVar98) ^ 0x8000000080000000;
  local_1680._8_4_ = -fVar98;
  local_1680._12_4_ = -fVar98;
  local_1680._16_4_ = -fVar98;
  local_1680._20_4_ = -fVar98;
  local_1680._24_4_ = -fVar98;
  local_1680._28_4_ = -fVar98;
  auVar103 = ZEXT3264(local_1680);
  iVar42 = (tray->tnear).field_0.i[k];
  local_16a0._4_4_ = iVar42;
  local_16a0._0_4_ = iVar42;
  local_16a0._8_4_ = iVar42;
  local_16a0._12_4_ = iVar42;
  local_16a0._16_4_ = iVar42;
  local_16a0._20_4_ = iVar42;
  local_16a0._24_4_ = iVar42;
  local_16a0._28_4_ = iVar42;
  auVar108 = ZEXT3264(local_16a0);
  iVar42 = (tray->tfar).field_0.i[k];
  local_16c0._4_4_ = iVar42;
  local_16c0._0_4_ = iVar42;
  local_16c0._8_4_ = iVar42;
  local_16c0._12_4_ = iVar42;
  local_16c0._16_4_ = iVar42;
  local_16c0._20_4_ = iVar42;
  local_16c0._24_4_ = iVar42;
  local_16c0._28_4_ = iVar42;
  auVar110 = ZEXT3264(local_16c0);
  puVar38 = mm_lookupmask_ps;
  local_1460._16_16_ = mm_lookupmask_ps._240_16_;
  local_1460._0_16_ = mm_lookupmask_ps._0_16_;
  local_1750 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  auVar68._8_4_ = 0x3f800000;
  auVar68._0_8_ = &DAT_3f8000003f800000;
  auVar68._12_4_ = 0x3f800000;
  auVar68._16_4_ = 0x3f800000;
  auVar68._20_4_ = 0x3f800000;
  auVar68._24_4_ = 0x3f800000;
  auVar68._28_4_ = 0x3f800000;
  auVar82._8_4_ = 0xbf800000;
  auVar82._0_8_ = 0xbf800000bf800000;
  auVar82._12_4_ = 0xbf800000;
  auVar82._16_4_ = 0xbf800000;
  auVar82._20_4_ = 0xbf800000;
  auVar82._24_4_ = 0xbf800000;
  auVar82._28_4_ = 0xbf800000;
  local_1480 = vblendvps_avx(auVar68,auVar82,local_1460);
  puVar47 = local_11f8;
  do {
    puVar46 = puVar47;
    if (puVar46 == &local_1200) break;
    puVar47 = puVar46 + -1;
    uVar55 = puVar46[-1];
    do {
      if ((uVar55 & 8) == 0) {
        uVar3 = *(undefined4 *)(ray + k * 4 + 0x70);
        auVar62._4_4_ = uVar3;
        auVar62._0_4_ = uVar3;
        auVar62._8_4_ = uVar3;
        auVar62._12_4_ = uVar3;
        auVar62._16_4_ = uVar3;
        auVar62._20_4_ = uVar3;
        auVar62._24_4_ = uVar3;
        auVar62._28_4_ = uVar3;
        uVar39 = uVar55 & 0xfffffffffffffff0;
        auVar60 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar39 + 0x100 + uVar45),auVar62,
                                  *(undefined1 (*) [32])(uVar39 + 0x40 + uVar45));
        auVar24 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar39 + 0x100 + uVar49),auVar62,
                                  *(undefined1 (*) [32])(uVar39 + 0x40 + uVar49));
        auVar60 = vfmadd213ps_fma(ZEXT1632(auVar60),auVar75._0_32_,auVar88._0_32_);
        auVar24 = vfmadd213ps_fma(ZEXT1632(auVar24),auVar78._0_32_,auVar94._0_32_);
        auVar82 = vpmaxsd_avx2(ZEXT1632(auVar60),ZEXT1632(auVar24));
        auVar60 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar39 + 0x100 + uVar52),auVar62,
                                  *(undefined1 (*) [32])(uVar39 + 0x40 + uVar52));
        auVar60 = vfmadd213ps_fma(ZEXT1632(auVar60),auVar84._0_32_,auVar103._0_32_);
        auVar68 = vpmaxsd_avx2(ZEXT1632(auVar60),auVar108._0_32_);
        auVar82 = vpmaxsd_avx2(auVar82,auVar68);
        auVar60 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar39 + 0x100 + (uVar45 ^ 0x20)),auVar62,
                                  *(undefined1 (*) [32])(uVar39 + 0x40 + (uVar45 ^ 0x20)));
        auVar60 = vfmadd213ps_fma(ZEXT1632(auVar60),auVar75._0_32_,auVar88._0_32_);
        auVar24 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar39 + 0x100 + (uVar49 ^ 0x20)),auVar62,
                                  *(undefined1 (*) [32])(uVar39 + 0x40 + (uVar49 ^ 0x20)));
        auVar24 = vfmadd213ps_fma(ZEXT1632(auVar24),auVar78._0_32_,auVar94._0_32_);
        auVar67 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar39 + 0x100 + (uVar52 ^ 0x20)),auVar62,
                                  *(undefined1 (*) [32])(uVar39 + 0x40 + (uVar52 ^ 0x20)));
        auVar68 = vpminsd_avx2(ZEXT1632(auVar60),ZEXT1632(auVar24));
        auVar60 = vfmadd213ps_fma(ZEXT1632(auVar67),auVar84._0_32_,auVar103._0_32_);
        auVar22 = vpminsd_avx2(ZEXT1632(auVar60),auVar110._0_32_);
        auVar68 = vpminsd_avx2(auVar68,auVar22);
        auVar82 = vcmpps_avx(auVar82,auVar68,2);
        if (((uint)uVar55 & 7) == 6) {
          auVar68 = vcmpps_avx(*(undefined1 (*) [32])(uVar39 + 0x1c0),auVar62,2);
          auVar22 = vcmpps_avx(auVar62,*(undefined1 (*) [32])(uVar39 + 0x1e0),1);
          auVar68 = vandps_avx(auVar68,auVar22);
          auVar82 = vandps_avx(auVar68,auVar82);
          auVar60 = vpackssdw_avx(auVar82._0_16_,auVar82._16_16_);
        }
        else {
          auVar60 = vpackssdw_avx(auVar82._0_16_,auVar82._16_16_);
        }
        auVar60 = vpsllw_avx(auVar60,0xf);
        auVar60 = vpacksswb_avx(auVar60,auVar60);
        puVar38 = (undefined1 *)
                  (ulong)(byte)(SUB161(auVar60 >> 7,0) & 1 | (SUB161(auVar60 >> 0xf,0) & 1) << 1 |
                                (SUB161(auVar60 >> 0x17,0) & 1) << 2 |
                                (SUB161(auVar60 >> 0x1f,0) & 1) << 3 |
                                (SUB161(auVar60 >> 0x27,0) & 1) << 4 |
                                (SUB161(auVar60 >> 0x2f,0) & 1) << 5 |
                                (SUB161(auVar60 >> 0x37,0) & 1) << 6 |
                               SUB161(auVar60 >> 0x3f,0) << 7);
      }
      if ((uVar55 & 8) == 0) {
        if (puVar38 == (undefined1 *)0x0) {
          uVar92 = 4;
        }
        else {
          uVar39 = uVar55 & 0xfffffffffffffff0;
          lVar43 = 0;
          for (puVar23 = puVar38; puVar40 = puVar38, ((ulong)puVar23 & 1) == 0;
              puVar23 = (undefined1 *)((ulong)puVar23 >> 1 | 0x8000000000000000)) {
            lVar43 = lVar43 + 1;
          }
          while( true ) {
            puVar40 = (undefined1 *)((ulong)(puVar40 + -1) & (ulong)puVar40);
            uVar55 = *(ulong *)(uVar39 + lVar43 * 8);
            if (puVar40 == (undefined1 *)0x0) break;
            *puVar47 = uVar55;
            puVar47 = puVar47 + 1;
            lVar43 = 0;
            for (puVar23 = puVar40; ((ulong)puVar23 & 1) == 0;
                puVar23 = (undefined1 *)((ulong)puVar23 >> 1 | 0x8000000000000000)) {
              lVar43 = lVar43 + 1;
            }
          }
          uVar92 = 0;
        }
      }
      else {
        uVar92 = 6;
      }
    } while (uVar92 == 0);
    if (uVar92 == 6) {
      uVar92 = 0;
      local_1748 = (ulong)((uint)uVar55 & 0xf) - 8;
      bVar58 = local_1748 != 0;
      if (bVar58) {
        uVar55 = uVar55 & 0xfffffffffffffff0;
        local_1740 = 0;
        do {
          lVar41 = local_1740 * 0x60;
          pSVar10 = context->scene;
          pRVar11 = (pSVar10->geometries).items;
          pGVar12 = pRVar11[*(uint *)(uVar55 + 0x40 + lVar41)].ptr;
          fVar1 = (pGVar12->time_range).lower;
          fVar1 = pGVar12->fnumTimeSegments *
                  ((*(float *)(ray + k * 4 + 0x70) - fVar1) / ((pGVar12->time_range).upper - fVar1))
          ;
          auVar60 = vroundss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),9);
          auVar60 = vminss_avx(auVar60,ZEXT416((uint)(pGVar12->fnumTimeSegments + -1.0)));
          auVar73 = vmaxss_avx(ZEXT816(0) << 0x20,auVar60);
          iVar42 = (int)auVar73._0_4_;
          lVar50 = (long)iVar42 * 0x38;
          lVar43 = *(long *)(*(long *)&pGVar12[2].numPrimitives + lVar50);
          local_1728 = (ulong)*(uint *)(uVar55 + 4 + lVar41);
          auVar60 = *(undefined1 (*) [16])(lVar43 + (ulong)*(uint *)(uVar55 + lVar41) * 4);
          local_1708 = (ulong)*(uint *)(uVar55 + 0x10 + lVar41);
          auVar24 = *(undefined1 (*) [16])(lVar43 + local_1708 * 4);
          local_16f8 = (ulong)*(uint *)(uVar55 + 0x20 + lVar41);
          auVar67 = *(undefined1 (*) [16])(lVar43 + local_16f8 * 4);
          uVar48 = (ulong)*(uint *)(uVar55 + 0x30 + lVar41);
          auVar5 = *(undefined1 (*) [16])(lVar43 + uVar48 * 4);
          local_1738 = *(long *)&pRVar11[*(uint *)(uVar55 + 0x44 + lVar41)].ptr[2].numPrimitives;
          lVar43 = *(long *)(local_1738 + lVar50);
          auVar6 = *(undefined1 (*) [16])(lVar43 + local_1728 * 4);
          local_1718 = (ulong)*(uint *)(uVar55 + 0x14 + lVar41);
          auVar61 = *(undefined1 (*) [16])(lVar43 + local_1718 * 4);
          local_1710 = (ulong)*(uint *)(uVar55 + 0x24 + lVar41);
          auVar7 = *(undefined1 (*) [16])(lVar43 + local_1710 * 4);
          local_1700 = (ulong)*(uint *)(uVar55 + 0x34 + lVar41);
          auVar8 = *(undefined1 (*) [16])(lVar43 + local_1700 * 4);
          lVar43 = *(long *)&pRVar11[*(uint *)(uVar55 + 0x48 + lVar41)].ptr[2].numPrimitives;
          lVar13 = *(long *)(lVar43 + lVar50);
          uVar44 = (ulong)*(uint *)(uVar55 + 8 + lVar41);
          auVar66 = *(undefined1 (*) [16])(lVar13 + uVar44 * 4);
          uVar56 = (ulong)*(uint *)(uVar55 + 0x18 + lVar41);
          auVar9 = *(undefined1 (*) [16])(lVar13 + uVar56 * 4);
          local_1730 = (ulong)*(uint *)(uVar55 + 0x28 + lVar41);
          auVar64 = *(undefined1 (*) [16])(lVar13 + local_1730 * 4);
          local_1720 = (ulong)*(uint *)(uVar55 + 0x38 + lVar41);
          auVar70 = *(undefined1 (*) [16])(lVar13 + local_1720 * 4);
          fVar1 = fVar1 - auVar73._0_4_;
          lVar13 = *(long *)&pRVar11[*(uint *)(uVar55 + 0x4c + lVar41)].ptr[2].numPrimitives;
          lVar50 = *(long *)(lVar13 + lVar50);
          uVar39 = (ulong)*(uint *)(uVar55 + 0xc + lVar41);
          auVar73 = *(undefined1 (*) [16])(lVar50 + uVar39 * 4);
          uVar54 = (ulong)*(uint *)(uVar55 + 0x1c + lVar41);
          auVar86 = *(undefined1 (*) [16])(lVar50 + uVar54 * 4);
          auVar72 = vunpcklps_avx(auVar60,auVar66);
          auVar66 = vunpckhps_avx(auVar60,auVar66);
          auVar76 = vunpcklps_avx(auVar6,auVar73);
          auVar6 = vunpckhps_avx(auVar6,auVar73);
          uVar51 = (ulong)*(uint *)(uVar55 + 0x2c + lVar41);
          auVar60 = *(undefined1 (*) [16])(lVar50 + uVar51 * 4);
          local_1530 = vunpcklps_avx(auVar66,auVar6);
          auVar66 = vunpcklps_avx(auVar72,auVar76);
          local_1550 = vunpckhps_avx(auVar72,auVar76);
          auVar73 = vunpcklps_avx(auVar24,auVar9);
          auVar6 = vunpckhps_avx(auVar24,auVar9);
          auVar9 = vunpcklps_avx(auVar61,auVar86);
          auVar61 = vunpckhps_avx(auVar61,auVar86);
          uVar53 = (ulong)*(uint *)(uVar55 + 0x3c + lVar41);
          auVar24 = *(undefined1 (*) [16])(lVar50 + uVar53 * 4);
          local_1520 = vunpcklps_avx(auVar6,auVar61);
          local_1560 = vunpcklps_avx(auVar73,auVar9);
          local_1540 = vunpckhps_avx(auVar73,auVar9);
          auVar61 = vunpcklps_avx(auVar67,auVar64);
          auVar67 = vunpckhps_avx(auVar67,auVar64);
          auVar9 = vunpcklps_avx(auVar7,auVar60);
          auVar6 = vunpckhps_avx(auVar7,auVar60);
          lVar57 = (long)(iVar42 + 1) * 0x38;
          lVar50 = *(long *)(*(long *)&pGVar12[2].numPrimitives + lVar57);
          auVar60 = *(undefined1 (*) [16])(lVar50 + (ulong)*(uint *)(uVar55 + lVar41) * 4);
          local_1570 = vunpcklps_avx(auVar67,auVar6);
          local_15b0 = vunpcklps_avx(auVar61,auVar9);
          local_1590 = vunpckhps_avx(auVar61,auVar9);
          auVar6 = vunpcklps_avx(auVar5,auVar70);
          auVar67 = vunpckhps_avx(auVar5,auVar70);
          auVar61 = vunpcklps_avx(auVar8,auVar24);
          auVar5 = vunpckhps_avx(auVar8,auVar24);
          lVar43 = *(long *)(lVar43 + lVar57);
          auVar24 = *(undefined1 (*) [16])(lVar43 + uVar44 * 4);
          local_1580 = vunpcklps_avx(auVar67,auVar5);
          local_15c0 = vunpcklps_avx(auVar6,auVar61);
          local_15a0 = vunpckhps_avx(auVar6,auVar61);
          lVar14 = *(long *)(local_1738 + lVar57);
          auVar5 = vunpcklps_avx(auVar60,auVar24);
          auVar67 = vunpckhps_avx(auVar60,auVar24);
          auVar60 = *(undefined1 (*) [16])(lVar14 + local_1728 * 4);
          lVar13 = *(long *)(lVar13 + lVar57);
          auVar24 = *(undefined1 (*) [16])(lVar13 + uVar39 * 4);
          auVar6 = vunpcklps_avx(auVar60,auVar24);
          auVar60 = vunpckhps_avx(auVar60,auVar24);
          auVar7 = vunpcklps_avx(auVar67,auVar60);
          auVar8 = vunpcklps_avx(auVar5,auVar6);
          auVar67 = vunpckhps_avx(auVar5,auVar6);
          auVar60 = *(undefined1 (*) [16])(lVar50 + local_1708 * 4);
          auVar24 = *(undefined1 (*) [16])(lVar43 + uVar56 * 4);
          auVar6 = vunpcklps_avx(auVar60,auVar24);
          auVar5 = vunpckhps_avx(auVar60,auVar24);
          auVar60 = *(undefined1 (*) [16])(lVar14 + local_1718 * 4);
          auVar24 = *(undefined1 (*) [16])(lVar13 + uVar54 * 4);
          auVar61 = vunpcklps_avx(auVar60,auVar24);
          auVar60 = vunpckhps_avx(auVar60,auVar24);
          auVar9 = vunpcklps_avx(auVar5,auVar60);
          auVar64 = vunpcklps_avx(auVar6,auVar61);
          auVar5 = vunpckhps_avx(auVar6,auVar61);
          auVar60 = *(undefined1 (*) [16])(lVar50 + local_16f8 * 4);
          auVar24 = *(undefined1 (*) [16])(lVar43 + local_1730 * 4);
          auVar61 = vunpcklps_avx(auVar60,auVar24);
          auVar6 = vunpckhps_avx(auVar60,auVar24);
          auVar60 = *(undefined1 (*) [16])(lVar14 + local_1710 * 4);
          auVar24 = *(undefined1 (*) [16])(lVar13 + uVar51 * 4);
          auVar70 = vunpcklps_avx(auVar60,auVar24);
          auVar60 = vunpckhps_avx(auVar60,auVar24);
          auVar73 = vunpcklps_avx(auVar6,auVar60);
          auVar86 = vunpcklps_avx(auVar61,auVar70);
          auVar6 = vunpckhps_avx(auVar61,auVar70);
          auVar60 = *(undefined1 (*) [16])(lVar50 + uVar48 * 4);
          auVar24 = *(undefined1 (*) [16])(lVar43 + local_1720 * 4);
          auVar70 = vunpcklps_avx(auVar60,auVar24);
          auVar61 = vunpckhps_avx(auVar60,auVar24);
          auVar60 = *(undefined1 (*) [16])(lVar14 + local_1700 * 4);
          auVar24 = *(undefined1 (*) [16])(lVar13 + uVar53 * 4);
          auVar72 = vunpcklps_avx(auVar60,auVar24);
          auVar60 = vunpckhps_avx(auVar60,auVar24);
          auVar24 = vunpcklps_avx(auVar61,auVar60);
          auVar61 = vunpcklps_avx(auVar70,auVar72);
          auVar60 = vunpckhps_avx(auVar70,auVar72);
          fVar2 = 1.0 - fVar1;
          auVar111._4_4_ = fVar2;
          auVar111._0_4_ = fVar2;
          auVar111._8_4_ = fVar2;
          auVar111._12_4_ = fVar2;
          auVar70._0_4_ = fVar1 * auVar8._0_4_;
          auVar70._4_4_ = fVar1 * auVar8._4_4_;
          auVar70._8_4_ = fVar1 * auVar8._8_4_;
          auVar70._12_4_ = fVar1 * auVar8._12_4_;
          auVar8 = vfmadd231ps_fma(auVar70,auVar111,auVar66);
          auVar76._0_4_ = fVar1 * auVar67._0_4_;
          auVar76._4_4_ = fVar1 * auVar67._4_4_;
          auVar76._8_4_ = fVar1 * auVar67._8_4_;
          auVar76._12_4_ = fVar1 * auVar67._12_4_;
          auVar67 = vfmadd231ps_fma(auVar76,auVar111,local_1550);
          auVar72._0_4_ = auVar7._0_4_ * fVar1;
          auVar72._4_4_ = auVar7._4_4_ * fVar1;
          auVar72._8_4_ = auVar7._8_4_ * fVar1;
          auVar72._12_4_ = auVar7._12_4_ * fVar1;
          auVar7 = vfmadd231ps_fma(auVar72,auVar111,local_1530);
          auVar66._0_4_ = fVar1 * auVar64._0_4_;
          auVar66._4_4_ = fVar1 * auVar64._4_4_;
          auVar66._8_4_ = fVar1 * auVar64._8_4_;
          auVar66._12_4_ = fVar1 * auVar64._12_4_;
          auVar66 = vfmadd231ps_fma(auVar66,auVar111,local_1560);
          auVar64._0_4_ = fVar1 * auVar5._0_4_;
          auVar64._4_4_ = fVar1 * auVar5._4_4_;
          auVar64._8_4_ = fVar1 * auVar5._8_4_;
          auVar64._12_4_ = fVar1 * auVar5._12_4_;
          auVar5 = vfmadd231ps_fma(auVar64,auVar111,local_1540);
          auVar79._0_4_ = auVar9._0_4_ * fVar1;
          auVar79._4_4_ = auVar9._4_4_ * fVar1;
          auVar79._8_4_ = auVar9._8_4_ * fVar1;
          auVar79._12_4_ = auVar9._12_4_ * fVar1;
          auVar9 = vfmadd231ps_fma(auVar79,auVar111,local_1520);
          auVar93._0_4_ = auVar86._0_4_ * fVar1;
          auVar93._4_4_ = auVar86._4_4_ * fVar1;
          auVar93._8_4_ = auVar86._8_4_ * fVar1;
          auVar93._12_4_ = auVar86._12_4_ * fVar1;
          auVar64 = vfmadd231ps_fma(auVar93,auVar111,local_15b0);
          auVar104._0_4_ = auVar6._0_4_ * fVar1;
          auVar104._4_4_ = auVar6._4_4_ * fVar1;
          auVar104._8_4_ = auVar6._8_4_ * fVar1;
          auVar104._12_4_ = auVar6._12_4_ * fVar1;
          auVar6 = vfmadd231ps_fma(auVar104,auVar111,local_1590);
          auVar109._0_4_ = auVar73._0_4_ * fVar1;
          auVar109._4_4_ = auVar73._4_4_ * fVar1;
          auVar109._8_4_ = auVar73._8_4_ * fVar1;
          auVar109._12_4_ = auVar73._12_4_ * fVar1;
          auVar70 = vfmadd231ps_fma(auVar109,auVar111,local_1570);
          auVar73._0_4_ = fVar1 * auVar61._0_4_;
          auVar73._4_4_ = fVar1 * auVar61._4_4_;
          auVar73._8_4_ = fVar1 * auVar61._8_4_;
          auVar73._12_4_ = fVar1 * auVar61._12_4_;
          auVar86._0_4_ = auVar60._0_4_ * fVar1;
          auVar86._4_4_ = auVar60._4_4_ * fVar1;
          auVar86._8_4_ = auVar60._8_4_ * fVar1;
          auVar86._12_4_ = auVar60._12_4_ * fVar1;
          auVar61._0_4_ = auVar24._0_4_ * fVar1;
          auVar61._4_4_ = auVar24._4_4_ * fVar1;
          auVar61._8_4_ = auVar24._8_4_ * fVar1;
          auVar61._12_4_ = auVar24._12_4_ * fVar1;
          lVar43 = uVar55 + 0x40 + lVar41;
          local_1400 = *(undefined8 *)(lVar43 + 0x10);
          uStack_13f8 = *(undefined8 *)(lVar43 + 0x18);
          auVar60 = vfmadd231ps_fma(auVar73,auVar111,local_15c0);
          uStack_13f0 = local_1400;
          uStack_13e8 = uStack_13f8;
          lVar41 = uVar55 + 0x50 + lVar41;
          local_1420 = *(undefined8 *)(lVar41 + 0x10);
          uStack_1418 = *(undefined8 *)(lVar41 + 0x18);
          auVar24 = vfmadd231ps_fma(auVar86,auVar111,local_15a0);
          auVar61 = vfmadd231ps_fma(auVar61,auVar111,local_1580);
          uStack_1410 = local_1420;
          uStack_1408 = uStack_1418;
          auVar71._16_16_ = auVar64;
          auVar71._0_16_ = auVar8;
          auVar77._16_16_ = auVar6;
          auVar77._0_16_ = auVar67;
          auVar105._16_16_ = auVar70;
          auVar105._0_16_ = auVar7;
          auVar69._16_16_ = auVar66;
          auVar69._0_16_ = auVar66;
          auVar65._16_16_ = auVar5;
          auVar65._0_16_ = auVar5;
          auVar80._16_16_ = auVar9;
          auVar80._0_16_ = auVar9;
          auVar74._16_16_ = auVar60;
          auVar74._0_16_ = auVar60;
          auVar101._16_16_ = auVar24;
          auVar101._0_16_ = auVar24;
          auVar63._16_16_ = auVar61;
          auVar63._0_16_ = auVar61;
          auVar68 = vsubps_avx(auVar71,auVar69);
          auVar82 = vsubps_avx(auVar77,auVar65);
          auVar22 = vsubps_avx(auVar105,auVar80);
          auVar62 = vsubps_avx(auVar74,auVar71);
          auVar18 = vsubps_avx(auVar101,auVar77);
          auVar19 = vsubps_avx(auVar63,auVar105);
          auVar20._4_4_ = auVar82._4_4_ * auVar19._4_4_;
          auVar20._0_4_ = auVar82._0_4_ * auVar19._0_4_;
          auVar20._8_4_ = auVar82._8_4_ * auVar19._8_4_;
          auVar20._12_4_ = auVar82._12_4_ * auVar19._12_4_;
          auVar20._16_4_ = auVar82._16_4_ * auVar19._16_4_;
          auVar20._20_4_ = auVar82._20_4_ * auVar19._20_4_;
          auVar20._24_4_ = auVar82._24_4_ * auVar19._24_4_;
          auVar20._28_4_ = auVar61._12_4_;
          auVar6 = vfmsub231ps_fma(auVar20,auVar18,auVar22);
          uVar3 = *(undefined4 *)(ray + k * 4);
          auVar81._4_4_ = uVar3;
          auVar81._0_4_ = uVar3;
          auVar81._8_4_ = uVar3;
          auVar81._12_4_ = uVar3;
          auVar81._16_4_ = uVar3;
          auVar81._20_4_ = uVar3;
          auVar81._24_4_ = uVar3;
          auVar81._28_4_ = uVar3;
          uVar3 = *(undefined4 *)(ray + k * 4 + 0x10);
          auVar113._4_4_ = uVar3;
          auVar113._0_4_ = uVar3;
          auVar113._8_4_ = uVar3;
          auVar113._12_4_ = uVar3;
          auVar113._16_4_ = uVar3;
          auVar113._20_4_ = uVar3;
          auVar113._24_4_ = uVar3;
          auVar113._28_4_ = uVar3;
          uVar3 = *(undefined4 *)(ray + k * 4 + 0x20);
          auVar115._4_4_ = uVar3;
          auVar115._0_4_ = uVar3;
          auVar115._8_4_ = uVar3;
          auVar115._12_4_ = uVar3;
          auVar115._16_4_ = uVar3;
          auVar115._20_4_ = uVar3;
          auVar115._24_4_ = uVar3;
          auVar115._28_4_ = uVar3;
          fVar1 = *(float *)(ray + k * 4 + 0x40);
          auVar102._4_4_ = fVar1;
          auVar102._0_4_ = fVar1;
          auVar102._8_4_ = fVar1;
          auVar102._12_4_ = fVar1;
          auVar102._16_4_ = fVar1;
          auVar102._20_4_ = fVar1;
          auVar102._24_4_ = fVar1;
          auVar102._28_4_ = fVar1;
          auVar21._4_4_ = auVar22._4_4_ * auVar62._4_4_;
          auVar21._0_4_ = auVar22._0_4_ * auVar62._0_4_;
          auVar21._8_4_ = auVar22._8_4_ * auVar62._8_4_;
          auVar21._12_4_ = auVar22._12_4_ * auVar62._12_4_;
          auVar21._16_4_ = auVar22._16_4_ * auVar62._16_4_;
          auVar21._20_4_ = auVar22._20_4_ * auVar62._20_4_;
          auVar21._24_4_ = auVar22._24_4_ * auVar62._24_4_;
          auVar21._28_4_ = auVar5._12_4_;
          auVar20 = vsubps_avx(auVar71,auVar81);
          fVar2 = *(float *)(ray + k * 4 + 0x50);
          auVar112._4_4_ = fVar2;
          auVar112._0_4_ = fVar2;
          auVar112._8_4_ = fVar2;
          auVar112._12_4_ = fVar2;
          auVar112._16_4_ = fVar2;
          auVar112._20_4_ = fVar2;
          auVar112._24_4_ = fVar2;
          auVar112._28_4_ = fVar2;
          auVar5 = vfmsub231ps_fma(auVar21,auVar19,auVar68);
          auVar21 = vsubps_avx(auVar77,auVar113);
          fVar98 = *(float *)(ray + k * 4 + 0x60);
          auVar114._4_4_ = fVar98;
          auVar114._0_4_ = fVar98;
          auVar114._8_4_ = fVar98;
          auVar114._12_4_ = fVar98;
          auVar114._16_4_ = fVar98;
          auVar114._20_4_ = fVar98;
          auVar114._24_4_ = fVar98;
          auVar114._28_4_ = fVar98;
          auVar63 = vsubps_avx(auVar105,auVar115);
          auVar25._4_4_ = fVar1 * auVar21._4_4_;
          auVar25._0_4_ = fVar1 * auVar21._0_4_;
          auVar25._8_4_ = fVar1 * auVar21._8_4_;
          auVar25._12_4_ = fVar1 * auVar21._12_4_;
          auVar25._16_4_ = fVar1 * auVar21._16_4_;
          auVar25._20_4_ = fVar1 * auVar21._20_4_;
          auVar25._24_4_ = fVar1 * auVar21._24_4_;
          auVar25._28_4_ = auVar70._12_4_;
          auVar60 = vfmsub231ps_fma(auVar25,auVar20,auVar112);
          auVar26._4_4_ = auVar19._4_4_ * auVar60._4_4_;
          auVar26._0_4_ = auVar19._0_4_ * auVar60._0_4_;
          auVar26._8_4_ = auVar19._8_4_ * auVar60._8_4_;
          auVar26._12_4_ = auVar19._12_4_ * auVar60._12_4_;
          auVar26._16_4_ = auVar19._16_4_ * 0.0;
          auVar26._20_4_ = auVar19._20_4_ * 0.0;
          auVar26._24_4_ = auVar19._24_4_ * 0.0;
          auVar26._28_4_ = auVar19._28_4_;
          auVar106._0_4_ = auVar22._0_4_ * auVar60._0_4_;
          auVar106._4_4_ = auVar22._4_4_ * auVar60._4_4_;
          auVar106._8_4_ = auVar22._8_4_ * auVar60._8_4_;
          auVar106._12_4_ = auVar22._12_4_ * auVar60._12_4_;
          auVar106._16_4_ = auVar22._16_4_ * 0.0;
          auVar106._20_4_ = auVar22._20_4_ * 0.0;
          auVar106._24_4_ = auVar22._24_4_ * 0.0;
          auVar106._28_4_ = 0;
          auVar19._4_4_ = fVar98 * auVar20._4_4_;
          auVar19._0_4_ = fVar98 * auVar20._0_4_;
          auVar19._8_4_ = fVar98 * auVar20._8_4_;
          auVar19._12_4_ = fVar98 * auVar20._12_4_;
          auVar19._16_4_ = fVar98 * auVar20._16_4_;
          auVar19._20_4_ = fVar98 * auVar20._20_4_;
          auVar19._24_4_ = fVar98 * auVar20._24_4_;
          auVar19._28_4_ = auVar22._28_4_;
          auVar24 = vfmsub231ps_fma(auVar19,auVar63,auVar102);
          auVar60 = vfmadd231ps_fma(auVar26,ZEXT1632(auVar24),auVar18);
          auVar24 = vfmadd231ps_fma(auVar106,auVar82,ZEXT1632(auVar24));
          auVar22._4_4_ = auVar68._4_4_ * auVar18._4_4_;
          auVar22._0_4_ = auVar68._0_4_ * auVar18._0_4_;
          auVar22._8_4_ = auVar68._8_4_ * auVar18._8_4_;
          auVar22._12_4_ = auVar68._12_4_ * auVar18._12_4_;
          auVar22._16_4_ = auVar68._16_4_ * auVar18._16_4_;
          auVar22._20_4_ = auVar68._20_4_ * auVar18._20_4_;
          auVar22._24_4_ = auVar68._24_4_ * auVar18._24_4_;
          auVar22._28_4_ = auVar18._28_4_;
          auVar61 = vfmsub231ps_fma(auVar22,auVar62,auVar82);
          auVar18._4_4_ = fVar2 * auVar63._4_4_;
          auVar18._0_4_ = fVar2 * auVar63._0_4_;
          auVar18._8_4_ = fVar2 * auVar63._8_4_;
          auVar18._12_4_ = fVar2 * auVar63._12_4_;
          auVar18._16_4_ = fVar2 * auVar63._16_4_;
          auVar18._20_4_ = fVar2 * auVar63._20_4_;
          auVar18._24_4_ = fVar2 * auVar63._24_4_;
          auVar18._28_4_ = auVar82._28_4_;
          auVar7 = vfmsub231ps_fma(auVar18,auVar21,auVar114);
          fVar1 = auVar61._0_4_;
          fVar2 = auVar61._4_4_;
          auVar27._4_4_ = fVar98 * fVar2;
          auVar27._0_4_ = fVar98 * fVar1;
          fVar16 = auVar61._8_4_;
          auVar27._8_4_ = fVar98 * fVar16;
          fVar17 = auVar61._12_4_;
          auVar27._12_4_ = fVar98 * fVar17;
          auVar27._16_4_ = fVar98 * 0.0;
          auVar27._20_4_ = fVar98 * 0.0;
          auVar27._24_4_ = fVar98 * 0.0;
          auVar27._28_4_ = fVar98;
          auVar67 = vfmadd231ps_fma(auVar27,ZEXT1632(auVar5),auVar112);
          auVar67 = vfmadd231ps_fma(ZEXT1632(auVar67),ZEXT1632(auVar6),auVar102);
          auVar60 = vfmadd231ps_fma(ZEXT1632(auVar60),ZEXT1632(auVar7),auVar62);
          auVar37._4_4_ = uStack_143c;
          auVar37._0_4_ = local_1440;
          auVar37._8_4_ = uStack_1438;
          auVar37._12_4_ = uStack_1434;
          auVar37._16_4_ = uStack_1430;
          auVar37._20_4_ = uStack_142c;
          auVar37._24_4_ = uStack_1428;
          auVar37._28_4_ = uStack_1424;
          auVar82 = vandps_avx(ZEXT1632(auVar67),auVar37);
          uVar92 = auVar82._0_4_;
          local_13e0._0_4_ = (float)(uVar92 ^ auVar60._0_4_);
          uVar95 = auVar82._4_4_;
          local_13e0._4_4_ = (float)(uVar95 ^ auVar60._4_4_);
          uVar96 = auVar82._8_4_;
          local_13e0._8_4_ = (float)(uVar96 ^ auVar60._8_4_);
          uVar97 = auVar82._12_4_;
          local_13e0._12_4_ = (float)(uVar97 ^ auVar60._12_4_);
          fVar98 = auVar82._16_4_;
          local_13e0._16_4_ = fVar98;
          fVar99 = auVar82._20_4_;
          local_13e0._20_4_ = fVar99;
          fVar100 = auVar82._24_4_;
          local_13e0._24_4_ = fVar100;
          fStack_1284 = auVar82._28_4_;
          local_13e0._28_4_ = fStack_1284;
          auVar60 = vfmadd231ps_fma(ZEXT1632(auVar24),auVar68,ZEXT1632(auVar7));
          local_13c0._0_4_ = (float)(uVar92 ^ auVar60._0_4_);
          local_13c0._4_4_ = (float)(uVar95 ^ auVar60._4_4_);
          local_13c0._8_4_ = (float)(uVar96 ^ auVar60._8_4_);
          local_13c0._12_4_ = (float)(uVar97 ^ auVar60._12_4_);
          local_13c0._16_4_ = fVar98;
          local_13c0._20_4_ = fVar99;
          local_13c0._24_4_ = fVar100;
          local_13c0._28_4_ = fStack_1284;
          auVar82 = vcmpps_avx(local_13e0,ZEXT832(0) << 0x20,5);
          auVar68 = vcmpps_avx(local_13c0,ZEXT832(0) << 0x20,5);
          auVar82 = vandps_avx(auVar82,auVar68);
          auVar87._8_4_ = 0x7fffffff;
          auVar87._0_8_ = 0x7fffffff7fffffff;
          auVar87._12_4_ = 0x7fffffff;
          auVar87._16_4_ = 0x7fffffff;
          auVar87._20_4_ = 0x7fffffff;
          auVar87._24_4_ = 0x7fffffff;
          auVar87._28_4_ = 0x7fffffff;
          local_1380 = vandps_avx(ZEXT1632(auVar67),auVar87);
          auVar68 = vcmpps_avx(ZEXT1632(auVar67),ZEXT832(0) << 0x20,4);
          auVar82 = vandps_avx(auVar82,auVar68);
          auVar107._0_4_ = local_13e0._0_4_ + local_13c0._0_4_;
          auVar107._4_4_ = local_13e0._4_4_ + local_13c0._4_4_;
          auVar107._8_4_ = local_13e0._8_4_ + local_13c0._8_4_;
          auVar107._12_4_ = local_13e0._12_4_ + local_13c0._12_4_;
          auVar107._16_4_ = fVar98 + fVar98;
          auVar107._20_4_ = fVar99 + fVar99;
          auVar107._24_4_ = fVar100 + fVar100;
          auVar107._28_4_ = fStack_1284 + fStack_1284;
          auVar68 = vcmpps_avx(auVar107,local_1380,2);
          auVar22 = auVar68 & auVar82;
          if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar22 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar22 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar22 >> 0x7f,0) != '\0') ||
                (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar22 >> 0xbf,0) != '\0') ||
              (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar22[0x1f] < '\0') {
            auVar82 = vandps_avx(auVar82,auVar68);
            auVar60 = vpackssdw_avx(auVar82._0_16_,auVar82._16_16_);
            auVar28._4_4_ = fVar2 * auVar63._4_4_;
            auVar28._0_4_ = fVar1 * auVar63._0_4_;
            auVar28._8_4_ = fVar16 * auVar63._8_4_;
            auVar28._12_4_ = fVar17 * auVar63._12_4_;
            auVar28._16_4_ = auVar63._16_4_ * 0.0;
            auVar28._20_4_ = auVar63._20_4_ * 0.0;
            auVar28._24_4_ = auVar63._24_4_ * 0.0;
            auVar28._28_4_ = auVar63._28_4_;
            auVar24 = vfmadd213ps_fma(auVar21,ZEXT1632(auVar5),auVar28);
            auVar24 = vfmadd213ps_fma(auVar20,ZEXT1632(auVar6),ZEXT1632(auVar24));
            local_13a0._0_4_ = (float)(uVar92 ^ auVar24._0_4_);
            local_13a0._4_4_ = (float)(uVar95 ^ auVar24._4_4_);
            local_13a0._8_4_ = (float)(uVar96 ^ auVar24._8_4_);
            local_13a0._12_4_ = (float)(uVar97 ^ auVar24._12_4_);
            local_13a0._16_4_ = fVar98;
            local_13a0._20_4_ = fVar99;
            local_13a0._24_4_ = fVar100;
            local_13a0._28_4_ = fStack_1284;
            fVar85 = *(float *)(ray + k * 4 + 0x30);
            auVar29._4_4_ = local_1380._4_4_ * fVar85;
            auVar29._0_4_ = local_1380._0_4_ * fVar85;
            auVar29._8_4_ = local_1380._8_4_ * fVar85;
            auVar29._12_4_ = local_1380._12_4_ * fVar85;
            auVar29._16_4_ = local_1380._16_4_ * fVar85;
            auVar29._20_4_ = local_1380._20_4_ * fVar85;
            auVar29._24_4_ = local_1380._24_4_ * fVar85;
            auVar29._28_4_ = fVar85;
            auVar82 = vcmpps_avx(auVar29,local_13a0,1);
            fVar85 = *(float *)(ray + k * 4 + 0x80);
            auVar30._4_4_ = local_1380._4_4_ * fVar85;
            auVar30._0_4_ = local_1380._0_4_ * fVar85;
            auVar30._8_4_ = local_1380._8_4_ * fVar85;
            auVar30._12_4_ = local_1380._12_4_ * fVar85;
            auVar30._16_4_ = local_1380._16_4_ * fVar85;
            auVar30._20_4_ = local_1380._20_4_ * fVar85;
            auVar30._24_4_ = local_1380._24_4_ * fVar85;
            auVar30._28_4_ = fVar85;
            auVar68 = vcmpps_avx(local_13a0,auVar30,2);
            auVar82 = vandps_avx(auVar82,auVar68);
            auVar24 = vpackssdw_avx(auVar82._0_16_,auVar82._16_16_);
            auVar60 = vpand_avx(auVar60,auVar24);
            auVar82 = vpmovzxwd_avx2(auVar60);
            auVar82 = vpslld_avx2(auVar82,0x1f);
            if ((((((((auVar82 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar82 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar82 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar82 >> 0x7f,0) != '\0') ||
                  (auVar82 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar82 >> 0xbf,0) != '\0') ||
                (auVar82 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar82[0x1f] < '\0') {
              local_1300 = vpsrad_avx2(auVar82,0x1f);
              local_1360 = ZEXT1632(auVar6);
              local_1340 = ZEXT1632(auVar5);
              local_1320 = ZEXT1632(auVar61);
              auVar82 = vrcpps_avx(local_1380);
              local_1220 = local_1460;
              auVar83._8_4_ = 0x3f800000;
              auVar83._0_8_ = &DAT_3f8000003f800000;
              auVar83._12_4_ = 0x3f800000;
              auVar83._16_4_ = 0x3f800000;
              auVar83._20_4_ = 0x3f800000;
              auVar83._24_4_ = 0x3f800000;
              auVar83._28_4_ = 0x3f800000;
              auVar24 = vfnmadd213ps_fma(local_1380,auVar82,auVar83);
              auVar24 = vfmadd132ps_fma(ZEXT1632(auVar24),auVar82,auVar82);
              fVar85 = auVar24._0_4_;
              fVar89 = auVar24._4_4_;
              fVar90 = auVar24._8_4_;
              fVar91 = auVar24._12_4_;
              local_12a0[0] = fVar85 * local_13a0._0_4_;
              local_12a0[1] = fVar89 * local_13a0._4_4_;
              local_12a0[2] = fVar90 * local_13a0._8_4_;
              local_12a0[3] = fVar91 * local_13a0._12_4_;
              fStack_1290 = fVar98 * 0.0;
              fStack_128c = fVar99 * 0.0;
              fStack_1288 = fVar100 * 0.0;
              auVar31._4_4_ = fVar89 * local_13e0._4_4_;
              auVar31._0_4_ = fVar85 * local_13e0._0_4_;
              auVar31._8_4_ = fVar90 * local_13e0._8_4_;
              auVar31._12_4_ = fVar91 * local_13e0._12_4_;
              auVar31._16_4_ = fVar98 * 0.0;
              auVar31._20_4_ = fVar99 * 0.0;
              auVar31._24_4_ = fVar100 * 0.0;
              auVar31._28_4_ = fStack_1284;
              auVar82 = vminps_avx(auVar31,auVar83);
              auVar32._4_4_ = fVar89 * local_13c0._4_4_;
              auVar32._0_4_ = fVar85 * local_13c0._0_4_;
              auVar32._8_4_ = fVar90 * local_13c0._8_4_;
              auVar32._12_4_ = fVar91 * local_13c0._12_4_;
              auVar32._16_4_ = fVar98 * 0.0;
              auVar32._20_4_ = fVar99 * 0.0;
              auVar32._24_4_ = fVar100 * 0.0;
              auVar32._28_4_ = fStack_1284;
              auVar68 = vminps_avx(auVar32,auVar83);
              auVar22 = vsubps_avx(auVar83,auVar82);
              auVar62 = vsubps_avx(auVar83,auVar68);
              local_12c0 = vblendvps_avx(auVar68,auVar22,local_1460);
              local_12e0 = vblendvps_avx(auVar82,auVar62,local_1460);
              fVar98 = local_1480._0_4_;
              local_1280._0_4_ = auVar6._0_4_ * fVar98;
              fVar99 = local_1480._4_4_;
              local_1280._4_4_ = auVar6._4_4_ * fVar99;
              fVar100 = local_1480._8_4_;
              local_1280._8_4_ = auVar6._8_4_ * fVar100;
              fVar85 = local_1480._12_4_;
              local_1280._12_4_ = auVar6._12_4_ * fVar85;
              fVar89 = local_1480._16_4_;
              local_1280._16_4_ = fVar89 * 0.0;
              fVar90 = local_1480._20_4_;
              local_1280._20_4_ = fVar90 * 0.0;
              fVar91 = local_1480._24_4_;
              local_1280._24_4_ = fVar91 * 0.0;
              local_1280._28_4_ = 0;
              local_1260._0_4_ = fVar98 * auVar5._0_4_;
              local_1260._4_4_ = fVar99 * auVar5._4_4_;
              local_1260._8_4_ = fVar100 * auVar5._8_4_;
              local_1260._12_4_ = fVar85 * auVar5._12_4_;
              local_1260._16_4_ = fVar89 * 0.0;
              local_1260._20_4_ = fVar90 * 0.0;
              local_1260._24_4_ = fVar91 * 0.0;
              local_1260._28_4_ = 0;
              local_1240._0_4_ = fVar98 * fVar1;
              local_1240._4_4_ = fVar99 * fVar2;
              local_1240._8_4_ = fVar100 * fVar16;
              local_1240._12_4_ = fVar85 * fVar17;
              local_1240._16_4_ = fVar89 * 0.0;
              local_1240._20_4_ = fVar90 * 0.0;
              local_1240._24_4_ = fVar91 * 0.0;
              local_1240._28_4_ = 0;
              auVar60 = vpsllw_avx(auVar60,0xf);
              auVar60 = vpacksswb_avx(auVar60,auVar60);
              uVar39 = (ulong)(byte)(SUB161(auVar60 >> 7,0) & 1 |
                                     (SUB161(auVar60 >> 0xf,0) & 1) << 1 |
                                     (SUB161(auVar60 >> 0x17,0) & 1) << 2 |
                                     (SUB161(auVar60 >> 0x1f,0) & 1) << 3 |
                                     (SUB161(auVar60 >> 0x27,0) & 1) << 4 |
                                     (SUB161(auVar60 >> 0x2f,0) & 1) << 5 |
                                     (SUB161(auVar60 >> 0x37,0) & 1) << 6 |
                                    SUB161(auVar60 >> 0x3f,0) << 7);
              auVar75 = ZEXT3264(local_15e0);
              auVar78 = ZEXT3264(local_1600);
              auVar84 = ZEXT3264(local_1620);
              auVar88 = ZEXT3264(local_1640);
              auVar94 = ZEXT3264(local_1660);
              auVar103 = ZEXT3264(local_1680);
              auVar108 = ZEXT3264(local_16a0);
              auVar110 = ZEXT3264(local_16c0);
              do {
                uVar48 = 0;
                for (uVar44 = uVar39; (uVar44 & 1) == 0; uVar44 = uVar44 >> 1 | 0x8000000000000000)
                {
                  uVar48 = uVar48 + 1;
                }
                uVar92 = *(uint *)((long)&local_1400 + uVar48 * 4);
                pGVar12 = (pSVar10->geometries).items[uVar92].ptr;
                if ((pGVar12->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  uVar39 = uVar39 ^ 1L << (uVar48 & 0x3f);
                  bVar59 = true;
                }
                else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                        (pGVar12->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                  bVar59 = false;
                }
                else {
                  uVar3 = *(undefined4 *)(ray + k * 4 + 0x80);
                  uVar44 = (ulong)(uint)((int)uVar48 * 4);
                  uVar4 = *(undefined4 *)(local_12e0 + uVar44);
                  local_14e0._4_4_ = uVar4;
                  local_14e0._0_4_ = uVar4;
                  local_14e0._8_4_ = uVar4;
                  local_14e0._12_4_ = uVar4;
                  uVar4 = *(undefined4 *)(local_12c0 + uVar44);
                  local_14d0._4_4_ = uVar4;
                  local_14d0._0_4_ = uVar4;
                  local_14d0._8_4_ = uVar4;
                  local_14d0._12_4_ = uVar4;
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)((long)local_12a0 + uVar44);
                  local_16f0.context = context->user;
                  local_14b0._4_4_ = uVar92;
                  local_14b0._0_4_ = uVar92;
                  local_14b0._8_4_ = uVar92;
                  local_14b0._12_4_ = uVar92;
                  uVar4 = *(undefined4 *)((long)&local_1420 + uVar44);
                  local_14c0._4_4_ = uVar4;
                  local_14c0._0_4_ = uVar4;
                  local_14c0._8_4_ = uVar4;
                  local_14c0._12_4_ = uVar4;
                  uVar4 = *(undefined4 *)(local_1280 + uVar44);
                  local_1510._4_4_ = uVar4;
                  local_1510._0_4_ = uVar4;
                  local_1510._8_4_ = uVar4;
                  local_1510._12_4_ = uVar4;
                  local_1500 = *(undefined4 *)(local_1260 + uVar44);
                  local_14f0 = *(undefined4 *)(local_1240 + uVar44);
                  vpcmpeqd_avx2(ZEXT1632(local_14b0),ZEXT1632(local_14b0));
                  uStack_149c = (local_16f0.context)->instID[0];
                  local_14a0 = uStack_149c;
                  uStack_1498 = uStack_149c;
                  uStack_1494 = uStack_149c;
                  uStack_1490 = (local_16f0.context)->instPrimID[0];
                  uStack_148c = uStack_1490;
                  uStack_1488 = uStack_1490;
                  uStack_1484 = uStack_1490;
                  local_1760 = *local_1750;
                  uStack_1758 = local_1750[1];
                  local_16f0.valid = (int *)&local_1760;
                  local_16f0.geometryUserPtr = pGVar12->userPtr;
                  local_16f0.hit = local_1510;
                  local_16f0.N = 4;
                  local_16f0.ray = (RTCRayN *)ray;
                  uStack_14fc = local_1500;
                  uStack_14f8 = local_1500;
                  uStack_14f4 = local_1500;
                  uStack_14ec = local_14f0;
                  uStack_14e8 = local_14f0;
                  uStack_14e4 = local_14f0;
                  if (pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar12->occlusionFilterN)(&local_16f0);
                  }
                  auVar60._8_8_ = uStack_1758;
                  auVar60._0_8_ = local_1760;
                  if (auVar60 == (undefined1  [16])0x0) {
                    auVar60 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                    auVar60 = auVar60 ^ _DAT_01febe20;
                  }
                  else {
                    p_Var15 = context->args->filter;
                    if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar12->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var15)(&local_16f0);
                    }
                    auVar24._8_8_ = uStack_1758;
                    auVar24._0_8_ = local_1760;
                    auVar24 = vpcmpeqd_avx((undefined1  [16])0x0,auVar24);
                    auVar60 = auVar24 ^ _DAT_01febe20;
                    auVar67._8_4_ = 0xff800000;
                    auVar67._0_8_ = 0xff800000ff800000;
                    auVar67._12_4_ = 0xff800000;
                    auVar24 = vblendvps_avx(auVar67,*(undefined1 (*) [16])(local_16f0.ray + 0x80),
                                            auVar24);
                    *(undefined1 (*) [16])(local_16f0.ray + 0x80) = auVar24;
                  }
                  auVar60 = vpslld_avx(auVar60,0x1f);
                  bVar35 = (auVar60 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
                  bVar36 = (auVar60 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
                  bVar34 = (auVar60 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
                  bVar33 = -1 < auVar60[0xf];
                  bVar59 = ((bVar35 && bVar36) && bVar34) && bVar33;
                  if (((bVar35 && bVar36) && bVar34) && bVar33) {
                    *(undefined4 *)(ray + k * 4 + 0x80) = uVar3;
                    uVar39 = uVar39 ^ 1L << (uVar48 & 0x3f);
                  }
                  auVar75 = ZEXT3264(local_15e0);
                  auVar78 = ZEXT3264(local_1600);
                  auVar84 = ZEXT3264(local_1620);
                  auVar88 = ZEXT3264(local_1640);
                  auVar94 = ZEXT3264(local_1660);
                  auVar103 = ZEXT3264(local_1680);
                  auVar108 = ZEXT3264(local_16a0);
                  auVar110 = ZEXT3264(local_16c0);
                }
                uVar92 = 0;
                if (!bVar59) {
                  if (bVar58) {
                    *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                    uVar92 = 1;
                  }
                  goto LAB_0066f61a;
                }
              } while (uVar39 != 0);
            }
          }
          local_1740 = local_1740 + 1;
          bVar58 = local_1740 < local_1748;
        } while (local_1740 != local_1748);
        auVar75 = ZEXT3264(local_15e0);
        auVar78 = ZEXT3264(local_1600);
        auVar84 = ZEXT3264(local_1620);
        auVar88 = ZEXT3264(local_1640);
        auVar94 = ZEXT3264(local_1660);
        auVar103 = ZEXT3264(local_1680);
        auVar108 = ZEXT3264(local_16a0);
        auVar110 = ZEXT3264(local_16c0);
        uVar92 = 0;
      }
    }
LAB_0066f61a:
  } while ((uVar92 & 3) == 0);
  return puVar46 != &local_1200;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }